

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.cpp
# Opt level: O1

void scale(Runtime *rt)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  mapped_type_conflict1 *pmVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> factorpervar;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> maxabscoefpervar;
  key_type_conflict1 local_bc;
  double local_b8;
  undefined8 uStack_b0;
  int local_9c;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_98;
  double local_68;
  undefined8 uStack_60;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_58;
  
  Instance::operator=(&rt->scaled,&rt->instance);
  scale_rows(rt);
  if ((rt->settings).varscaling == true) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl._0_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < (rt->scaled).num_var) {
      do {
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,(key_type_conflict1 *)&local_98);
        *pmVar5 = 0.0;
        local_98._M_impl._0_4_ = local_98._M_impl._0_4_ + 1;
      } while ((int)local_98._M_impl._0_4_ < (rt->scaled).num_var);
    }
    local_98._M_impl._0_4_ = 0;
    if (0 < (rt->scaled).num_var) {
      lVar6 = 0;
      do {
        piVar3 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[(int)lVar6];
        lVar6 = (long)iVar1;
        if (iVar1 < piVar3[(long)(int)local_98._M_impl._0_4_ + 1]) {
          do {
            local_b8 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar6];
            uStack_b0 = 0;
            pmVar5 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)&local_58,(key_type_conflict1 *)&local_98);
            if (*pmVar5 <= ABS(local_b8) && ABS(local_b8) != *pmVar5) {
              local_b8 = (rt->scaled).A.mat.value.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6];
              uStack_b0 = 0;
              pmVar5 = std::
                       map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                     *)&local_58,(key_type_conflict1 *)&local_98);
              *pmVar5 = ABS(local_b8);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(long)(int)local_98._M_impl._0_4_ + 1]);
        }
        piVar3 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[(int)local_98._M_impl._0_4_];
        lVar7 = (long)iVar1;
        lVar6 = (long)(int)local_98._M_impl._0_4_;
        if (iVar1 < piVar3[lVar6 + 1]) {
          do {
            if ((rt->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7] == (int)lVar6) {
              pmVar5 = std::
                       map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                     *)&local_58,(key_type_conflict1 *)&local_98);
              local_b8 = *pmVar5;
              dVar8 = ABS((rt->scaled).Q.mat.value.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7]);
              if (dVar8 < 0.0) {
                local_68 = sqrt(dVar8);
                uStack_60 = extraout_XMM0_Qb;
              }
              else {
                local_68 = SQRT(dVar8);
                uStack_60 = 0;
              }
              pmVar5 = std::
                       map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                     *)&local_58,(key_type_conflict1 *)&local_98);
              dVar8 = local_68;
              if (local_68 <= local_b8) {
                dVar8 = local_b8;
              }
              *pmVar5 = (mapped_type_conflict1)
                        (~-(ulong)NAN(local_b8) & (ulong)dVar8 |
                        -(ulong)NAN(local_b8) & (ulong)local_68);
            }
            lVar7 = lVar7 + 1;
            lVar6 = (long)(int)local_98._M_impl._0_4_;
          } while (lVar7 < (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar6 + 1]);
        }
        lVar6 = lVar6 + 1;
        local_98._M_impl._0_4_ = SUB84(lVar6,0);
      } while ((int)local_98._M_impl._0_4_ < (rt->scaled).num_var);
    }
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_bc = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < (rt->scaled).num_var) {
      do {
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,&local_bc);
        log2(*pmVar5);
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,&local_bc);
        *pmVar5 = 1.0;
        local_bc = local_bc + 1;
      } while (local_bc < (rt->scaled).num_var);
    }
    local_bc = 0;
    if (0 < (rt->scaled).num_var) {
      do {
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,&local_bc);
        dVar8 = *pmVar5;
        lVar6 = (long)local_bc;
        piVar3 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[lVar6];
        lVar7 = (long)iVar1;
        iVar2 = piVar3[lVar6 + 1];
        if (iVar1 < iVar2) {
          pdVar4 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            pdVar4[lVar7] = pdVar4[lVar7] / dVar8;
            lVar7 = lVar7 + 1;
          } while (iVar2 != lVar7);
        }
        local_bc = local_bc + 1;
        pdVar4 = (rt->scaled).c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4[lVar6] = pdVar4[lVar6] / dVar8;
      } while (local_bc < (rt->scaled).num_var);
    }
    local_bc = 0;
    if (0 < (rt->scaled).num_var) {
      do {
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,&local_bc);
        piVar3 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[local_bc];
        lVar6 = (long)iVar1;
        if (iVar1 < piVar3[(long)local_bc + 1]) {
          local_b8 = *pmVar5;
          do {
            local_9c = (rt->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar6];
            pmVar5 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)&local_98,&local_9c);
            pdVar4 = (rt->scaled).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar4[lVar6] = pdVar4[lVar6] / (*pmVar5 * local_b8);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[(long)local_bc + 1]);
        }
        local_bc = local_bc + 1;
      } while (local_bc < (rt->scaled).num_var);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_98);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_58);
  }
  scale_rows(rt);
  return;
}

Assistant:

void scale(Runtime& rt) {
  rt.scaled = rt.instance;
  scale_rows(rt);
  scale_cols(rt);
  scale_rows(rt);
}